

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O1

btBroadphasePair * __thiscall
btSortedOverlappingPairCache::findPair
          (btSortedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1)

{
  uint uVar1;
  btOverlapFilterCallback *pbVar2;
  int iVar3;
  ulong uVar4;
  btBroadphaseProxy **ppbVar5;
  btBroadphaseProxy *pbVar6;
  char cVar7;
  
  pbVar2 = this->m_overlapFilterCallback;
  if (pbVar2 == (btOverlapFilterCallback *)0x0) {
    if ((ushort)(proxy0->m_collisionFilterGroup & proxy1->m_collisionFilterMask) == 0) {
      return (btBroadphasePair *)0x0;
    }
    cVar7 = (ushort)(proxy1->m_collisionFilterGroup & proxy0->m_collisionFilterMask) != 0;
  }
  else {
    iVar3 = (*pbVar2->_vptr_btOverlapFilterCallback[2])(pbVar2,proxy0,proxy1);
    cVar7 = (char)iVar3;
  }
  if (cVar7 == '\0') {
    return (btBroadphasePair *)0x0;
  }
  pbVar6 = proxy1;
  if (proxy0->m_uniqueId < proxy1->m_uniqueId) {
    pbVar6 = proxy0;
    proxy0 = proxy1;
  }
  uVar1 = (this->m_overlappingPairArray).m_size;
  if (0 < (int)uVar1) {
    ppbVar5 = &((this->m_overlappingPairArray).m_data)->m_pProxy1;
    uVar4 = 0;
    do {
      if ((((btBroadphasePair *)(ppbVar5 + -1))->m_pProxy0 == pbVar6) && (*ppbVar5 == proxy0))
      goto LAB_00138cf1;
      uVar4 = uVar4 + 1;
      ppbVar5 = ppbVar5 + 4;
    } while (uVar1 != uVar4);
  }
  uVar4 = (ulong)uVar1;
LAB_00138cf1:
  if ((int)uVar4 < (int)uVar1) {
    return (this->m_overlappingPairArray).m_data + (int)uVar4;
  }
  return (btBroadphasePair *)0x0;
}

Assistant:

btBroadphasePair*	btSortedOverlappingPairCache::findPair(btBroadphaseProxy* proxy0,btBroadphaseProxy* proxy1)
{
	if (!needsBroadphaseCollision(proxy0,proxy1))
		return 0;

	btBroadphasePair tmpPair(*proxy0,*proxy1);
	int findIndex = m_overlappingPairArray.findLinearSearch(tmpPair);

	if (findIndex < m_overlappingPairArray.size())
	{
		//btAssert(it != m_overlappingPairSet.end());
		 btBroadphasePair* pair = &m_overlappingPairArray[findIndex];
		return pair;
	}
	return 0;
}